

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O2

Error __thiscall
llvm::dwarf::CFIProgram::parse
          (CFIProgram *this,DWARFDataExtractor Data,uint64_t *Offset,uint64_t EndOffset)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  char *Fmt;
  ulong in_RCX;
  ulong uVar5;
  byte Opcode_00;
  error_code EC;
  uint8_t Opcode;
  
LAB_00d89a22:
  while( true ) {
    if (in_RCX <= *(ulong *)EndOffset) {
      (this->Instructions).
      super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      return (Error)(ErrorInfoBase *)this;
    }
    uVar2 = DWARFDataExtractor::getRelocatedValue
                      (&Data,1,(uint64_t *)EndOffset,(uint64_t *)0x0,(Error *)0x0);
    Opcode_00 = (byte)uVar2;
    if ((uVar2 & 0xc0) == 0) break;
    addInstruction((CFIProgram *)Offset,Opcode_00 & 0xc0,(ulong)((uint)uVar2 & 0x3f));
  }
  switch(uVar2 & 0xff) {
  case 0:
  case 10:
  case 0xb:
  case 0x2d:
    addInstruction((CFIProgram *)Offset,Opcode_00);
    goto LAB_00d89a22;
  case 1:
    uVar2 = DWARFDataExtractor::getRelocatedAddress(&Data,(uint64_t *)EndOffset,(uint64_t *)0x0);
    Opcode_00 = 1;
    break;
  case 2:
    uVar2 = DWARFDataExtractor::getRelocatedValue
                      (&Data,1,(uint64_t *)EndOffset,(uint64_t *)0x0,(Error *)0x0);
    Opcode_00 = 2;
    break;
  case 3:
    uVar2 = DWARFDataExtractor::getRelocatedValue
                      (&Data,2,(uint64_t *)EndOffset,(uint64_t *)0x0,(Error *)0x0);
    Opcode_00 = 3;
    break;
  case 4:
    uVar2 = DWARFDataExtractor::getRelocatedValue
                      (&Data,4,(uint64_t *)EndOffset,(uint64_t *)0x0,(Error *)0x0);
    Opcode_00 = 4;
    break;
  case 5:
  case 9:
  case 0xc:
  case 0x14:
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
    uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
    goto LAB_00d89aff;
  case 6:
  case 7:
  case 8:
  case 0xd:
  case 0xe:
  case 0x2e:
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
    break;
  case 0xf:
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
    addInstruction((CFIProgram *)Offset,'\x0f',0);
    uVar4 = *(ulong *)EndOffset;
    uVar1 = uVar4 + (uVar2 & 0xffffffff);
    if (Data.super_DataExtractor.Data.Length < uVar4) {
      uVar4 = Data.super_DataExtractor.Data.Length;
    }
    uVar5 = uVar1;
    if (uVar1 < uVar4) {
      uVar5 = uVar4;
    }
    if (Data.super_DataExtractor.Data.Length < uVar1) {
      uVar5 = Data.super_DataExtractor.Data.Length;
    }
    uVar3 = Offset[1];
    if (*(char *)(uVar3 - 8) == '\0') {
      *(undefined1 *)(uVar3 - 8) = 1;
    }
    *(char **)(uVar3 - 0x28) = Data.super_DataExtractor.Data.Data + uVar4;
    *(ulong *)(uVar3 - 0x20) = uVar5 - uVar4;
    *(bool *)(uVar3 - 0x18) = Data.super_DataExtractor.IsLittleEndian != '\0';
    *(uint8_t *)(uVar3 - 0x17) = Data.super_DataExtractor.AddressSize;
    *(ushort *)(uVar3 - 0x10) = (ushort)Data.super_DataExtractor.AddressSize;
    *(undefined1 *)(uVar3 - 0xe) = 4;
    *(uint64_t *)EndOffset = *(long *)EndOffset + (uVar2 & 0xffffffff);
    goto LAB_00d89a22;
  case 0x10:
  case 0x16:
    goto switchD_00d89a88_caseD_10;
  case 0x11:
  case 0x12:
  case 0x15:
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
    uVar3 = DataExtractor::getSLEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset);
LAB_00d89aff:
    addInstruction((CFIProgram *)Offset,Opcode_00,uVar2,uVar3);
    goto LAB_00d89a22;
  case 0x13:
    uVar2 = DataExtractor::getSLEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset);
    Opcode_00 = 0x13;
    break;
  default:
    Fmt = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x54;
    EC._0_8_ = this;
    createStringError<unsigned_char>(EC,Fmt,(uchar *)"Invalid extended CFI opcode 0x%x");
    return (Error)(ErrorInfoBase *)this;
  }
  addInstruction((CFIProgram *)Offset,Opcode_00,uVar2);
  goto LAB_00d89a22;
switchD_00d89a88_caseD_10:
  uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
  uVar3 = DataExtractor::getULEB128(&Data.super_DataExtractor,(uint64_t *)EndOffset,(Error *)0x0);
  addInstruction((CFIProgram *)Offset,Opcode_00,uVar2,0);
  uVar4 = *(ulong *)EndOffset;
  uVar1 = uVar4 + uVar3;
  if (Data.super_DataExtractor.Data.Length < uVar4) {
    uVar4 = Data.super_DataExtractor.Data.Length;
  }
  uVar5 = uVar1;
  if (uVar1 < uVar4) {
    uVar5 = uVar4;
  }
  if (Data.super_DataExtractor.Data.Length < uVar1) {
    uVar5 = Data.super_DataExtractor.Data.Length;
  }
  uVar2 = Offset[1];
  if (*(char *)(uVar2 - 8) == '\0') {
    *(undefined1 *)(uVar2 - 8) = 1;
  }
  *(char **)(uVar2 - 0x28) = Data.super_DataExtractor.Data.Data + uVar4;
  *(ulong *)(uVar2 - 0x20) = uVar5 - uVar4;
  *(bool *)(uVar2 - 0x18) = Data.super_DataExtractor.IsLittleEndian != '\0';
  *(uint8_t *)(uVar2 - 0x17) = Data.super_DataExtractor.AddressSize;
  *(ushort *)(uVar2 - 0x10) = (ushort)Data.super_DataExtractor.AddressSize;
  *(undefined1 *)(uVar2 - 0xe) = 4;
  *(uint64_t *)EndOffset = *(long *)EndOffset + uVar3;
  goto LAB_00d89a22;
}

Assistant:

Error CFIProgram::parse(DWARFDataExtractor Data, uint64_t *Offset,
                        uint64_t EndOffset) {
  while (*Offset < EndOffset) {
    uint8_t Opcode = Data.getRelocatedValue(1, Offset);
    // Some instructions have a primary opcode encoded in the top bits.
    uint8_t Primary = Opcode & DWARF_CFI_PRIMARY_OPCODE_MASK;

    if (Primary) {
      // If it's a primary opcode, the first operand is encoded in the bottom
      // bits of the opcode itself.
      uint64_t Op1 = Opcode & DWARF_CFI_PRIMARY_OPERAND_MASK;
      switch (Primary) {
      default:
        return createStringError(errc::illegal_byte_sequence,
                                 "Invalid primary CFI opcode 0x%" PRIx8,
                                 Primary);
      case DW_CFA_advance_loc:
      case DW_CFA_restore:
        addInstruction(Primary, Op1);
        break;
      case DW_CFA_offset:
        addInstruction(Primary, Op1, Data.getULEB128(Offset));
        break;
      }
    } else {
      // Extended opcode - its value is Opcode itself.
      switch (Opcode) {
      default:
        return createStringError(errc::illegal_byte_sequence,
                                 "Invalid extended CFI opcode 0x%" PRIx8,
                                 Opcode);
      case DW_CFA_nop:
      case DW_CFA_remember_state:
      case DW_CFA_restore_state:
      case DW_CFA_GNU_window_save:
        // No operands
        addInstruction(Opcode);
        break;
      case DW_CFA_set_loc:
        // Operands: Address
        addInstruction(Opcode, Data.getRelocatedAddress(Offset));
        break;
      case DW_CFA_advance_loc1:
        // Operands: 1-byte delta
        addInstruction(Opcode, Data.getRelocatedValue(1, Offset));
        break;
      case DW_CFA_advance_loc2:
        // Operands: 2-byte delta
        addInstruction(Opcode, Data.getRelocatedValue(2, Offset));
        break;
      case DW_CFA_advance_loc4:
        // Operands: 4-byte delta
        addInstruction(Opcode, Data.getRelocatedValue(4, Offset));
        break;
      case DW_CFA_restore_extended:
      case DW_CFA_undefined:
      case DW_CFA_same_value:
      case DW_CFA_def_cfa_register:
      case DW_CFA_def_cfa_offset:
      case DW_CFA_GNU_args_size:
        // Operands: ULEB128
        addInstruction(Opcode, Data.getULEB128(Offset));
        break;
      case DW_CFA_def_cfa_offset_sf:
        // Operands: SLEB128
        addInstruction(Opcode, Data.getSLEB128(Offset));
        break;
      case DW_CFA_offset_extended:
      case DW_CFA_register:
      case DW_CFA_def_cfa:
      case DW_CFA_val_offset: {
        // Operands: ULEB128, ULEB128
        // Note: We can not embed getULEB128 directly into function
        // argument list. getULEB128 changes Offset and order of evaluation
        // for arguments is unspecified.
        auto op1 = Data.getULEB128(Offset);
        auto op2 = Data.getULEB128(Offset);
        addInstruction(Opcode, op1, op2);
        break;
        }
        case DW_CFA_offset_extended_sf:
        case DW_CFA_def_cfa_sf:
        case DW_CFA_val_offset_sf: {
          // Operands: ULEB128, SLEB128
          // Note: see comment for the previous case
          auto op1 = Data.getULEB128(Offset);
          auto op2 = (uint64_t)Data.getSLEB128(Offset);
          addInstruction(Opcode, op1, op2);
          break;
        }
        case DW_CFA_def_cfa_expression: {
          uint32_t ExprLength = Data.getULEB128(Offset);
          addInstruction(Opcode, 0);
          DataExtractor Extractor(
              Data.getData().slice(*Offset, *Offset + ExprLength),
              Data.isLittleEndian(), Data.getAddressSize());
          Instructions.back().Expression = DWARFExpression(
              Extractor, Data.getAddressSize(), dwarf::DWARF_VERSION);
          *Offset += ExprLength;
          break;
        }
        case DW_CFA_expression:
        case DW_CFA_val_expression: {
          auto RegNum = Data.getULEB128(Offset);
          auto BlockLength = Data.getULEB128(Offset);
          addInstruction(Opcode, RegNum, 0);
          DataExtractor Extractor(
              Data.getData().slice(*Offset, *Offset + BlockLength),
              Data.isLittleEndian(), Data.getAddressSize());
          Instructions.back().Expression = DWARFExpression(
              Extractor, Data.getAddressSize(), dwarf::DWARF_VERSION);
          *Offset += BlockLength;
          break;
        }
      }
    }
  }

  return Error::success();
}